

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O0

void __thiscall HighsNodeQueue::unlink_domchgs(HighsNodeQueue *this,int64_t node)

{
  int iVar1;
  reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  size_type in_RSI;
  long in_RDI;
  const_iterator __position;
  HighsInt col;
  HighsInt i;
  HighsInt numchgs;
  pointer in_stack_ffffffffffffffa0;
  int local_18;
  
  pvVar2 = std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::
           operator[]((vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_> *
                      )(in_RDI + 8),in_RSI);
  sVar3 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
                    (&pvVar2->domchgstack);
  for (local_18 = 0; local_18 != (int)sVar3; local_18 = local_18 + 1) {
    __position._M_node = (_Base_ptr)(in_RDI + 8);
    pvVar2 = std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::
             operator[]((vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                         *)__position._M_node,in_RSI);
    pvVar4 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                       (&pvVar2->domchgstack,(long)local_18);
    iVar1 = pvVar4->column;
    pvVar2 = std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::
             operator[]((vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                         *)__position._M_node,in_RSI);
    pvVar4 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                       (&pvVar2->domchgstack,(long)local_18);
    if (pvVar4->boundtype == kLower) {
      in_stack_ffffffffffffffa0 =
           std::
           unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
           ::get((unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                  *)in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + iVar1;
      pvVar2 = std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::
               operator[]((vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                           *)(in_RDI + 8),in_RSI);
      std::
      vector<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
      ::operator[](&pvVar2->domchglinks,(long)local_18);
      std::
      set<std::pair<double,long>,std::less<std::pair<double,long>>,HighsNodeQueue::NodesetAllocator<std::pair<double,long>>>
      ::erase_abi_cxx11_(in_stack_ffffffffffffffa0,__position);
    }
    else if (pvVar4->boundtype == kUpper) {
      std::
      unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
      ::get((unique_ptr<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
             *)in_stack_ffffffffffffffa0);
      pvVar2 = std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::
               operator[]((vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                           *)(in_RDI + 8),in_RSI);
      std::
      vector<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
      ::operator[](&pvVar2->domchglinks,(long)local_18);
      std::
      set<std::pair<double,long>,std::less<std::pair<double,long>>,HighsNodeQueue::NodesetAllocator<std::pair<double,long>>>
      ::erase_abi_cxx11_(in_stack_ffffffffffffffa0,__position);
    }
  }
  std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::operator[]
            ((vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_> *)
             (in_RDI + 8),in_RSI);
  std::
  vector<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
  ::clear((vector<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
           *)0x658c8a);
  std::vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>::operator[]
            ((vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_> *)
             (in_RDI + 8),in_RSI);
  std::
  vector<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
  ::shrink_to_fit((vector<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
                   *)0x658ca9);
  return;
}

Assistant:

void HighsNodeQueue::unlink_domchgs(int64_t node) {
  assert(node != -1);
  HighsInt numchgs = nodes[node].domchgstack.size();

  for (HighsInt i = 0; i != numchgs; ++i) {
    HighsInt col = nodes[node].domchgstack[i].column;
    switch (nodes[node].domchgstack[i].boundtype) {
      case HighsBoundType::kLower:
        colLowerNodesPtr.get()[col].erase(nodes[node].domchglinks[i]);
        break;
      case HighsBoundType::kUpper:
        colUpperNodesPtr.get()[col].erase(nodes[node].domchglinks[i]);
    }
  }

  nodes[node].domchglinks.clear();
  nodes[node].domchglinks.shrink_to_fit();
}